

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_camellia_hw.c
# Opt level: O0

int cipher_hw_camellia_initkey(PROV_CIPHER_CTX *dat,uchar *key,size_t keylen)

{
  int iVar1;
  int line;
  code *pcVar2;
  char *in_RDX;
  uchar *in_RSI;
  char *in_RDI;
  CAMELLIA_KEY *ks;
  PROV_CAMELLIA_CTX *adat;
  int mode;
  int ret;
  char *func;
  int local_4;
  
  iVar1 = *(int *)(in_RDI + 0x10);
  *(CAMELLIA_KEY **)(in_RDI + 0xb0) = (CAMELLIA_KEY *)(in_RDI + 0xc0);
  func = in_RDI;
  line = Camellia_set_key(in_RSI,(int)((long)in_RDX << 3),(CAMELLIA_KEY *)(in_RDI + 0xc0));
  if (line < 0) {
    ERR_new();
    ERR_set_debug(in_RDX,line,func);
    ERR_set_error(0x39,0x65,(char *)0x0);
    local_4 = 0;
  }
  else {
    if ((((byte)in_RDI[0x3c] >> 1 & 1) == 0) && ((iVar1 == 1 || (iVar1 == 2)))) {
      *(code **)in_RDI = Camellia_decrypt;
      pcVar2 = (code *)0x0;
      if (iVar1 == 2) {
        pcVar2 = Camellia_cbc_encrypt;
      }
      *(code **)(in_RDI + 8) = pcVar2;
    }
    else {
      *(code **)in_RDI = Camellia_encrypt;
      pcVar2 = (code *)0x0;
      if (iVar1 == 2) {
        pcVar2 = Camellia_cbc_encrypt;
      }
      *(code **)(in_RDI + 8) = pcVar2;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int cipher_hw_camellia_initkey(PROV_CIPHER_CTX *dat,
                                      const unsigned char *key, size_t keylen)
{
    int ret, mode = dat->mode;
    PROV_CAMELLIA_CTX *adat = (PROV_CAMELLIA_CTX *)dat;
    CAMELLIA_KEY *ks = &adat->ks.ks;

    dat->ks = ks;
    ret = Camellia_set_key(key, keylen * 8, ks);
    if (ret < 0) {
        ERR_raise(ERR_LIB_PROV, PROV_R_KEY_SETUP_FAILED);
        return 0;
    }
    if (dat->enc || (mode != EVP_CIPH_ECB_MODE && mode != EVP_CIPH_CBC_MODE)) {
        dat->block = (block128_f) Camellia_encrypt;
        dat->stream.cbc = mode == EVP_CIPH_CBC_MODE ?
            (cbc128_f) Camellia_cbc_encrypt : NULL;
    } else {
        dat->block = (block128_f) Camellia_decrypt;
        dat->stream.cbc = mode == EVP_CIPH_CBC_MODE ?
            (cbc128_f) Camellia_cbc_encrypt : NULL;
    }
    return 1;
}